

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generalizers.cpp
# Opt level: O0

bool Am_Handle_Placeholders_And_Call_Command
               (int cnt,Am_Object *cmd,Am_Selective_Allowed_Method *same_allowed_method,
               Am_Handler_Selective_Undo_Method *same_method,
               Am_Selective_New_Allowed_Method *new_allowed_method,
               Am_Handler_Selective_Repeat_New_Method *new_method,Am_Object *sel_widget,
               Am_Object *undo_handler,Am_Object *new_cmd)

{
  Am_Selective_New_Allowed_Method_Type *pAVar1;
  Am_Handler_Selective_Repeat_New_Method_Type *pAVar2;
  Am_Selective_Allowed_Method_Type *pAVar3;
  Am_Handler_Selective_Undo_Method_Type *pAVar4;
  bool bVar5;
  ostream *poVar6;
  void *pvVar7;
  Am_Value *pAVar8;
  anon_union_8_8_ea4c8939_for_value *new_start_object;
  anon_union_8_8_ea4c8939_for_value new_loc_value;
  Am_Value AVar9;
  Am_Value AVar10;
  Am_Value AVar11;
  Am_Value AVar12;
  bool local_b7a;
  ostrstream local_b30 [8];
  ostrstream oss_3;
  char local_9c8 [8];
  char line_3 [250];
  Am_Object local_8c0;
  Am_String s;
  Am_Object local_8b0;
  Am_Object local_8a8;
  ostrstream local_8a0 [8];
  ostrstream oss_2;
  char local_738 [8];
  char line_2 [250];
  Am_Object local_630;
  Am_Value local_628;
  Am_Value local_618;
  Am_Object local_608;
  Am_Object local_600;
  Am_Object local_5f8;
  ostrstream local_5f0 [8];
  ostrstream oss_1;
  char local_488 [8];
  char line_1 [250];
  Am_Value local_378;
  Am_Object local_368;
  undefined1 local_35a;
  byte local_359;
  bool selectdir;
  Am_Object local_350;
  undefined4 local_344;
  Am_Object local_340;
  bool local_331;
  undefined1 local_330 [7];
  bool ok;
  Am_Value new_value;
  Am_Value new_obj_mod;
  Am_Value orig_value;
  Am_Value orig_obj_modified;
  bool replaced_value;
  bool replaced_create;
  bool replaced_obj_mod;
  ostrstream local_2d0 [8];
  ostrstream oss;
  char local_168 [8];
  char line [300];
  Am_Handler_Selective_Repeat_New_Method *new_method_local;
  Am_Selective_New_Allowed_Method *new_allowed_method_local;
  Am_Handler_Selective_Undo_Method *same_method_local;
  Am_Selective_Allowed_Method *same_allowed_method_local;
  Am_Object *cmd_local;
  int cnt_local;
  
  Am_Beep_Happened = false;
  unique0x10000dab = new_method;
  std::ostrstream::ostrstream(local_2d0,local_168,300,_S_out);
  reset_ostrstream(local_2d0);
  Am_Object::Am_Object((Am_Object *)&stack0xfffffffffffffd18,cmd);
  am_write_command_name((Am_Object *)&stack0xfffffffffffffd18,cnt,local_2d0);
  Am_Object::~Am_Object((Am_Object *)&stack0xfffffffffffffd18);
  if ((am_sdebug & 1U) != 0) {
    poVar6 = std::operator<<((ostream *)&std::cout,"Doing cmd: ");
    poVar6 = std::operator<<(poVar6,local_168);
    poVar6 = std::operator<<(poVar6," || ");
    poVar6 = operator<<(poVar6,cmd);
    pvVar7 = (void *)std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(pvVar7,std::flush<char,std::char_traits<char>>);
  }
  orig_obj_modified.value.long_value._7_1_ = 0;
  orig_obj_modified.value.long_value._6_1_ = 0;
  orig_obj_modified.value.long_value._5_1_ = 0;
  Am_Value::Am_Value((Am_Value *)&orig_value.value);
  Am_Value::Am_Value((Am_Value *)&new_obj_mod.value);
  Am_Value::Am_Value((Am_Value *)&new_value.value);
  Am_Value::Am_Value((Am_Value *)local_330);
  Am_Object::Am_Object(&local_340,&Am_Object_Create_Command);
  bVar5 = Am_Object::Is_Instance_Of(cmd,&local_340);
  Am_Object::~Am_Object(&local_340);
  if ((((bVar5 ^ 0xffU) & 1) != 0) &&
     (new_method = (Am_Handler_Selective_Repeat_New_Method *)sel_widget,
     local_331 = Am_Replace_Placeholders
                           (cmd,0x16d,(bool *)((long)&orig_obj_modified.value + 7),
                            (Am_Value *)&orig_value.value,(Am_Value *)&new_value.value,sel_widget),
     !local_331)) {
    cmd_local._7_1_ = false;
    local_344 = 1;
    goto LAB_0029df13;
  }
  local_359 = 0;
  Am_Object::Am_Object(&local_350,&Am_Object_Create_Command);
  bVar5 = Am_Object::Is_Instance_Of(cmd,&local_350);
  local_b7a = true;
  if (!bVar5) {
    Am_Object::Am_Object((Am_Object *)&stack0xfffffffffffffca8,&Am_Find_Command);
    local_359 = 1;
    local_b7a = Am_Object::Is_Instance_Of(cmd,(Am_Object *)&stack0xfffffffffffffca8);
  }
  if ((local_359 & 1) != 0) {
    Am_Object::~Am_Object((Am_Object *)&stack0xfffffffffffffca8);
  }
  Am_Object::~Am_Object(&local_350);
  if (local_b7a == false) {
    local_331 = Am_Replace_Placeholders
                          (cmd,0x16d,(bool *)((long)&orig_obj_modified.value + 7),
                           (Am_Value *)&orig_value.value,(Am_Value *)&new_value.value,sel_widget);
    if (!local_331) {
      cmd_local._7_1_ = false;
      local_344 = 1;
      goto LAB_0029df13;
    }
    new_start_object = &new_obj_mod.value;
    new_loc_value.wrapper_value = (Am_Wrapper *)local_330;
    new_method = (Am_Handler_Selective_Repeat_New_Method *)sel_widget;
    local_331 = Am_Replace_Placeholders
                          (cmd,0x169,(bool *)((long)&orig_obj_modified.value + 5),
                           (Am_Value *)new_start_object,(Am_Value *)new_loc_value.wrapper_value,
                           sel_widget);
    if (!local_331) {
      cmd_local._7_1_ = false;
      local_344 = 1;
      goto LAB_0029df13;
    }
  }
  else {
    new_start_object = &new_value.value;
    new_loc_value.wrapper_value = (Am_Wrapper *)local_330;
    local_331 = Am_Replace_Create_Placeholders
                          (cmd,(bool *)((long)&orig_obj_modified.value + 6),sel_widget,
                           (Am_Value *)new_start_object,(Am_Value *)new_loc_value.wrapper_value);
    if (!local_331) {
      cmd_local._7_1_ = false;
      local_344 = 1;
      goto LAB_0029df13;
    }
  }
  if ((am_sdebug & 1U) != 0) {
    poVar6 = std::operator<<((ostream *)&std::cout,"%% Going to call method on cmd ");
    poVar6 = operator<<(poVar6,cmd);
    pvVar7 = (void *)std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(pvVar7,std::flush<char,std::char_traits<char>>);
  }
  pAVar8 = Am_Object::Peek(cmd,0xef,0);
  local_35a = Am_Value::Valid(pAVar8);
  if (((((orig_obj_modified.value.long_value._7_1_ & 1) != 0) ||
       ((orig_obj_modified.value.long_value._5_1_ & 1) != 0)) ||
      ((orig_obj_modified.value.long_value._6_1_ & 1) != 0)) || ((bool)local_35a)) {
    pAVar1 = new_allowed_method->Call;
    Am_Object::Am_Object(&local_368,cmd);
    Am_Value::Am_Value(&local_378,(Am_Value *)&new_value.value);
    Am_Value::Am_Value((Am_Value *)(line_1 + 0xf8),(Am_Value *)local_330);
    AVar9.value.proc_value = (Am_Generic_Procedure *)(line_1 + 0xf8);
    AVar9._0_8_ = &local_378;
    AVar10.value.wrapper_value = new_loc_value.wrapper_value;
    AVar10._0_8_ = new_start_object;
    bVar5 = (*pAVar1)((Am_Object_Data *)&local_368,AVar9,AVar10);
    Am_Value::~Am_Value((Am_Value *)(line_1 + 0xf8));
    Am_Value::~Am_Value(&local_378);
    Am_Object::~Am_Object(&local_368);
    if (((bVar5 ^ 0xffU) & 1) != 0) {
      std::ostrstream::ostrstream(local_5f0,local_488,0xfa,_S_out);
      poVar6 = std::operator<<((ostream *)local_5f0,"Can\'t execute command ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,cnt);
      poVar6 = std::operator<<(poVar6,". ");
      pAVar8 = Am_Object::Get(cmd,0x150,0);
      poVar6 = operator<<(poVar6,pAVar8);
      poVar6 = std::operator<<(poVar6," on NEW objects  ");
      poVar6 = operator<<(poVar6,(Am_Value *)&new_value.value);
      poVar6 = std::operator<<(poVar6," with new value ");
      poVar6 = operator<<(poVar6,(Am_Value *)local_330);
      poVar6 = std::operator<<(poVar6,"; command object ");
      poVar6 = operator<<(poVar6,cmd);
      std::ostream::operator<<(poVar6,std::ends<char,std::char_traits<char>>);
      Am_Pop_Up_Error_Window(local_488);
      std::ostrstream::~ostrstream(local_5f0);
      cmd_local._7_1_ = false;
      local_344 = 1;
      goto LAB_0029df13;
    }
    if ((am_sdebug & 1U) != 0) {
      poVar6 = std::operator<<((ostream *)&std::cout,"%% ");
      poVar6 = operator<<(poVar6,stack0xffffffffffffffc8);
      poVar6 = std::operator<<(poVar6," on ");
      poVar6 = operator<<(poVar6,cmd);
      poVar6 = std::operator<<(poVar6," new_obj ");
      poVar6 = operator<<(poVar6,(Am_Value *)&new_value.value);
      poVar6 = std::operator<<(poVar6," val ");
      poVar6 = operator<<(poVar6,(Am_Value *)local_330);
      pvVar7 = (void *)std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<(pvVar7,std::flush<char,std::char_traits<char>>);
    }
    pAVar2 = stack0xffffffffffffffc8->Call;
    Am_Object::Am_Object(&local_600,undo_handler);
    Am_Object::Am_Object(&local_608,cmd);
    Am_Value::Am_Value(&local_618,(Am_Value *)&new_value.value);
    Am_Value::Am_Value(&local_628,(Am_Value *)local_330);
    AVar11.value.wrapper_value = (Am_Wrapper *)&local_618;
    AVar11._0_8_ = &local_608;
    AVar12.value = (anon_union_8_8_ea4c8939_for_value)(anon_union_8_8_ea4c8939_for_value)new_method;
    AVar12._0_8_ = &local_628;
    (*pAVar2)((Am_Object_Data *)&local_5f8,(Am_Object_Data *)&local_600,AVar11,AVar12);
    Am_Object::operator=(new_cmd,&local_5f8);
    Am_Object::~Am_Object(&local_5f8);
    Am_Value::~Am_Value(&local_628);
    Am_Value::~Am_Value(&local_618);
    Am_Object::~Am_Object(&local_608);
    Am_Object::~Am_Object(&local_600);
  }
  else {
    pAVar3 = same_allowed_method->Call;
    Am_Object::Am_Object(&local_630,cmd);
    bVar5 = (*pAVar3)((Am_Object_Data *)&local_630);
    Am_Object::~Am_Object(&local_630);
    if (((bVar5 ^ 0xffU) & 1) != 0) {
      std::ostrstream::ostrstream(local_8a0,local_738,0xfa,_S_out);
      poVar6 = std::operator<<((ostream *)local_8a0,"Can\'t execute command ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,cnt);
      poVar6 = std::operator<<(poVar6,". ");
      pAVar8 = Am_Object::Get(cmd,0x150,0);
      poVar6 = operator<<(poVar6,pAVar8);
      poVar6 = std::operator<<(poVar6," on SAME; command object ");
      poVar6 = operator<<(poVar6,cmd);
      std::ostream::operator<<(poVar6,std::ends<char,std::char_traits<char>>);
      Am_Pop_Up_Error_Window(local_738);
      std::ostrstream::~ostrstream(local_8a0);
      cmd_local._7_1_ = false;
      local_344 = 1;
      goto LAB_0029df13;
    }
    pAVar4 = same_method->Call;
    Am_Object::Am_Object(&local_8b0,undo_handler);
    Am_Object::Am_Object((Am_Object *)&s,cmd);
    (*pAVar4)((Am_Object_Data *)&local_8a8,(Am_Object_Data *)&local_8b0);
    Am_Object::operator=(new_cmd,&local_8a8);
    Am_Object::~Am_Object(&local_8a8);
    Am_Object::~Am_Object((Am_Object *)&s);
    Am_Object::~Am_Object(&local_8b0);
  }
  bVar5 = find_objects_for_placeholders(Am_PLACEHOLDERS_SET_BY_THIS_COMMAND,cmd,new_cmd,sel_widget);
  if (bVar5) {
    if ((Am_Beep_Happened & 1U) == 0) {
      cmd_local._7_1_ = true;
      local_344 = 1;
    }
    else {
      am_gen_command_label(&local_8c0);
      std::ostrstream::ostrstream(local_b30,local_9c8,0xfa,_S_out);
      poVar6 = std::operator<<((ostream *)local_b30,"Quitting due to Beep from command ");
      poVar6 = operator<<(poVar6,(Am_String *)&local_8c0);
      poVar6 = std::operator<<(poVar6,"; command object ");
      poVar6 = operator<<(poVar6,cmd);
      std::ostream::operator<<(poVar6,std::ends<char,std::char_traits<char>>);
      Am_Pop_Up_Error_Window(local_9c8);
      std::ostrstream::~ostrstream(local_b30);
      cmd_local._7_1_ = false;
      local_344 = 1;
      Am_String::~Am_String((Am_String *)&local_8c0);
    }
  }
  else {
    cmd_local._7_1_ = false;
    local_344 = 1;
  }
LAB_0029df13:
  Am_Value::~Am_Value((Am_Value *)local_330);
  Am_Value::~Am_Value((Am_Value *)&new_value.value);
  Am_Value::~Am_Value((Am_Value *)&new_obj_mod.value);
  Am_Value::~Am_Value((Am_Value *)&orig_value.value);
  std::ostrstream::~ostrstream(local_2d0);
  return cmd_local._7_1_;
}

Assistant:

bool
Am_Handle_Placeholders_And_Call_Command(
    int cnt, Am_Object &cmd, Am_Selective_Allowed_Method &same_allowed_method,
    Am_Handler_Selective_Undo_Method &same_method,
    Am_Selective_New_Allowed_Method &new_allowed_method,
    Am_Handler_Selective_Repeat_New_Method &new_method, Am_Object &sel_widget,
    Am_Object &undo_handler, Am_Object &new_cmd)
{
  char line[300];

  Am_Beep_Happened = false; //global in opal_advanced.h

  OSTRSTREAM_CONSTR(oss, line, 300, std::ios::out);
  reset_ostrstream(oss); // go to the beginning
  am_write_command_name(cmd, cnt, oss);
  OSTRSTREAM_COPY(oss, line, 300);
  if (am_sdebug)
    std::cout << "Doing cmd: " << line << " || " << cmd << std::endl
              << std::flush;

  bool replaced_obj_mod = false;
  bool replaced_create = false;
  bool replaced_value = false;
  Am_Value orig_obj_modified, orig_value, new_obj_mod, new_value;
  bool ok;

  if (!cmd.Is_Instance_Of(Am_Object_Create_Command)) {
    ok = Am_Replace_Placeholders(cmd, Am_OBJECT_MODIFIED, replaced_obj_mod,
                                 orig_obj_modified, new_obj_mod, sel_widget);
    if (!ok)
      return false;
  }
  if (cmd.Is_Instance_Of(Am_Object_Create_Command) ||
      cmd.Is_Instance_Of(Am_Find_Command)) {
    ok = Am_Replace_Create_Placeholders(cmd, replaced_create, sel_widget,
                                        new_obj_mod, new_value);
    if (!ok) {
      return false;
    }
  } else {
    ok = Am_Replace_Placeholders(cmd, Am_OBJECT_MODIFIED, replaced_obj_mod,
                                 orig_obj_modified, new_obj_mod, sel_widget);
    if (!ok)
      return false;
    ok = Am_Replace_Placeholders(cmd, Am_VALUE, replaced_value, orig_value,
                                 new_value, sel_widget);
    if (!ok) {
      return false;
    }
  }

  if (am_sdebug)
    std::cout << "%% Going to call method on cmd " << cmd << std::endl
              << std::flush;

  bool selectdir = cmd.Peek(Am_CURRENT_DIRECTION).Valid(); //HACK

  if (replaced_obj_mod || replaced_value || replaced_create || selectdir) {
    if (!new_allowed_method.Call(cmd, new_obj_mod, new_value)) {
      AM_POP_UP_ERROR_WINDOW("Can't execute command "
                             << cnt << ". " << cmd.Get(Am_LABEL)
                             << " on NEW objects  " << new_obj_mod
                             << " with new value " << new_value
                             << "; command object " << cmd);
      return false;
    }
    if (am_sdebug)
      std::cout << "%% " << new_method << " on " << cmd << " new_obj "
                << new_obj_mod << " val " << new_value << std::endl
                << std::flush;
    new_cmd = new_method.Call(undo_handler, cmd, new_obj_mod, new_value);
  } else { // not on new objects
    if (!same_allowed_method.Call(cmd)) {
      AM_POP_UP_ERROR_WINDOW("Can't execute command "
                             << cnt << ". " << cmd.Get(Am_LABEL)
                             << " on SAME; command object " << cmd);
      return false;
    }
    new_cmd = same_method.Call(undo_handler, cmd);
  }

  if (!find_objects_for_placeholders(Am_PLACEHOLDERS_SET_BY_THIS_COMMAND, cmd,
                                     new_cmd, sel_widget)) {
    return false;
  }
  if (Am_Beep_Happened) {
    Am_String s = am_gen_command_label(cmd);
    AM_POP_UP_ERROR_WINDOW("Quitting due to Beep from command "
                           << s << "; command object " << cmd);
    return false;
  }
  return true;
}